

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_txid.cpp
# Opt level: O2

void __thiscall Txid_TxidEmpty_Test::TestBody(Txid_TxidEmpty_Test *this)

{
  char *pcVar1;
  AssertHelper local_68;
  AssertionResult gtest_ar;
  string local_50;
  int local_2c;
  Txid txid;
  
  cfd::core::Txid::Txid(&txid);
  cfd::core::Txid::GetHex_abi_cxx11_(&local_50,&txid);
  pcVar1 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"txid.GetHex().c_str()","\"\"",local_50._M_dataplus._M_p,"");
  std::__cxx11::string::~string((string *)&local_50);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_txid.cpp"
               ,0x10,pcVar1);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::Txid::GetData((ByteData *)&local_50,&txid);
  local_68.data_ = (AssertHelperData *)cfd::core::ByteData::GetDataSize((ByteData *)&local_50);
  local_2c = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar,"txid.GetData().GetDataSize()","0",(unsigned_long *)&local_68,
             &local_2c);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_50);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_txid.cpp"
               ,0x11,pcVar1);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::Txid::~Txid(&txid);
  return;
}

Assistant:

TEST(Txid, TxidEmpty) {
  // cfd::core::CfdCoreHandle handle = nullptr;
  // cfd::core::Initialize(&handle);
  Txid txid;
  EXPECT_STREQ(txid.GetHex().c_str(), "");
  EXPECT_EQ(txid.GetData().GetDataSize(), 0);
}